

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool google::protobuf::compiler::anon_unknown_5::ContainsProto3Optional(Descriptor *desc)

{
  bool bVar1;
  FieldDescriptor *pFVar2;
  long lVar3;
  Descriptor *pDVar4;
  bool bVar5;
  int iVar6;
  _GLOBAL__N_1 local_30 [16];
  
  bVar5 = 0 < *(int *)(desc + 4);
  if (0 < *(int *)(desc + 4)) {
    iVar6 = 0;
    do {
      pFVar2 = Descriptor::field(desc,iVar6);
      if ((char)pFVar2[3] < '\0') {
        if (((byte)pFVar2[1] & 0x10) == 0) {
          lVar3 = 0;
        }
        else {
          lVar3 = *(long *)(pFVar2 + 0x28);
          if (lVar3 == 0) goto LAB_0016c38c;
        }
        if (lVar3 == 0) {
          google::protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xac6);
        }
        if ((*(int *)(lVar3 + 4) == 1) && ((*(byte *)(*(long *)(lVar3 + 0x30) + 1) & 2) != 0)) {
          _GLOBAL__N_1::ContainsProto3Optional(local_30);
          goto LAB_0016c38c;
        }
        if (-1 < (char)pFVar2[3]) goto LAB_0016c2ea;
      }
      else {
LAB_0016c2ea:
        pFVar2 = Descriptor::field(desc,iVar6);
        if (((byte)pFVar2[1] & 0x10) != 0) {
          if (*(long *)(pFVar2 + 0x28) == 0) {
LAB_0016c38c:
            google::protobuf::internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xa9a);
          }
          if (((byte)pFVar2[1] & 0x10) != 0) {
            if (bVar5) {
              return true;
            }
            break;
          }
        }
      }
      iVar6 = iVar6 + 1;
      bVar5 = iVar6 < *(int *)(desc + 4);
    } while (iVar6 < *(int *)(desc + 4));
  }
  bVar5 = 0 < *(int *)(desc + 0x80);
  if (0 < *(int *)(desc + 0x80)) {
    pDVar4 = Descriptor::nested_type(desc,0);
    bVar1 = ContainsProto3Optional(pDVar4);
    if (!bVar1) {
      iVar6 = 1;
      do {
        bVar5 = iVar6 < *(int *)(desc + 0x80);
        if (*(int *)(desc + 0x80) <= iVar6) {
          return bVar5;
        }
        pDVar4 = Descriptor::nested_type(desc,iVar6);
        bVar1 = ContainsProto3Optional(pDVar4);
        iVar6 = iVar6 + 1;
      } while (!bVar1);
    }
  }
  return bVar5;
}

Assistant:

bool ContainsProto3Optional(const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); ++i) {
    if (desc->field(i)->real_containing_oneof() == nullptr &&
        desc->field(i)->containing_oneof() != nullptr) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); ++i) {
    if (ContainsProto3Optional(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}